

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparsehashtable.h
# Opt level: O2

iterator * __thiscall
google::
sparse_hashtable<char_const*,char_const*,Hasher,Identity,SetKey<char_const*,Identity>,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>
::find<char_const*>(iterator *__return_storage_ptr__,
                   sparse_hashtable<char_const*,char_const*,Hasher,Identity,SetKey<char_const*,Identity>,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>
                   *this,char **key)

{
  pair<unsigned_long,_unsigned_long> pVar1;
  nonempty_iterator local_68;
  nonempty_iterator local_48;
  
  if (*(long *)(this + 0x90) != *(long *)(this + 0x48)) {
    pVar1 = find_position<char_const*>(this,key);
    if (pVar1.first != 0xffffffffffffffff) {
      sparsetable<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
      ::get_iter(&local_48,
                 (sparsetable<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                  *)(this + 0x50),pVar1.first);
      sparsetable<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
      ::nonempty_end(&local_68,
                     (sparsetable<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                      *)(this + 0x50));
      (__return_storage_ptr__->end).row_current._M_current = local_68.row_current._M_current;
      (__return_storage_ptr__->end).col_current = local_68.col_current;
      (__return_storage_ptr__->end).row_begin._M_current = local_68.row_begin._M_current;
      (__return_storage_ptr__->end).row_end._M_current = local_68.row_end._M_current;
      (__return_storage_ptr__->pos).row_begin._M_current = local_48.row_begin._M_current;
      (__return_storage_ptr__->pos).row_end._M_current = local_48.row_end._M_current;
      (__return_storage_ptr__->pos).row_current._M_current = local_48.row_current._M_current;
      (__return_storage_ptr__->pos).col_current = local_48.col_current;
      __return_storage_ptr__->ht =
           (sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
            *)this;
      sparse_hashtable_iterator<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
      ::advance_past_deleted(__return_storage_ptr__);
      return __return_storage_ptr__;
    }
  }
  sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::end(__return_storage_ptr__,
        (sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
         *)this);
  return __return_storage_ptr__;
}

Assistant:

iterator find(const K& key) {
    if (size() == 0) return end();
    std::pair<size_type, size_type> pos = find_position(key);
    if (pos.first == ILLEGAL_BUCKET)  // alas, not there
      return end();
    else
      return iterator(this, table.get_iter(pos.first), table.nonempty_end());
  }